

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_x86.cpp
# Opt level: O2

int __thiscall
ncnn::Convolution_x86::forward_int8_x86
          (Convolution_x86 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  int *piVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  char cVar11;
  char cVar12;
  char cVar13;
  char cVar14;
  char cVar15;
  char cVar16;
  char cVar17;
  char cVar18;
  size_t sVar19;
  _func_int *p_Var20;
  Layer *pLVar21;
  undefined8 uVar22;
  undefined8 uVar23;
  Allocator *pAVar24;
  size_t sVar25;
  int iVar26;
  undefined1 uVar27;
  int u;
  int iVar28;
  int iVar29;
  int iVar30;
  int iVar31;
  int iVar32;
  _func_int **pp_Var33;
  ulong uVar34;
  ulong uVar35;
  long lVar36;
  long lVar37;
  ulong uVar38;
  int iVar39;
  int iVar40;
  int iVar41;
  long lVar42;
  uint uVar43;
  int iVar44;
  int iVar45;
  float *pfVar46;
  long lVar47;
  ulong uVar48;
  int n_1;
  float *pfVar49;
  int iVar50;
  float *pfVar51;
  int iVar52;
  int iVar53;
  ulong uVar54;
  ulong uVar55;
  long lVar56;
  Convolution *this_00;
  int n;
  int iVar57;
  long lVar58;
  int p;
  undefined1 *puVar59;
  void *pvVar60;
  long lVar61;
  ulong uVar62;
  int i;
  int iVar63;
  uint uVar64;
  int iVar65;
  long lVar66;
  long lVar67;
  int p_1;
  long lVar68;
  float *pfVar69;
  char *pcVar70;
  float fVar71;
  float fVar72;
  float fVar73;
  float fVar74;
  int sum0 [4];
  long local_320;
  undefined1 *local_318;
  undefined1 *local_310;
  undefined1 *local_300;
  Option opt_g_1;
  size_t local_2b0;
  Mat top_blob_g;
  long local_250;
  long local_240;
  int sum1 [4];
  int sum2 [4];
  Option opt_g;
  int local_17c;
  Mat bottom_blob_bordered;
  vector<float,_std::allocator<float>_> requantize_scales;
  int sum3 [4];
  _Vector_base<float,_std::allocator<float>_> local_e8;
  _Vector_base<float,_std::allocator<float>_> local_d0;
  Mat top_blob_tm;
  Mat bottom_blob_unbordered;
  
  this_00 = (Convolution *)
            ((long)&this->_vptr_Convolution_x86 + (long)this->_vptr_Convolution_x86[-3]);
  iVar28 = *(int *)(this->_vptr_Convolution_x86[-3] + 4 +
                   (long)&(this->weight_3x3_winograd23_data_int8).data);
  if ((1 < iVar28) || (iVar57 = this_00->dilation_h, 1 < iVar57)) {
    iVar28 = Convolution::forward(this_00,bottom_blob,top_blob,opt);
    return iVar28;
  }
  sVar19 = bottom_blob->elemsize;
  iVar63 = this_00->kernel_w;
  iVar32 = this_00->kernel_h;
  Mat::Mat(&bottom_blob_unbordered,bottom_blob);
  if (sVar19 != 1) {
    opt_g.use_int8_arithmetic = opt->use_int8_arithmetic;
    opt_g.use_packing_layout = opt->use_packing_layout;
    opt_g.use_shader_pack8 = opt->use_shader_pack8;
    opt_g.use_image_storage = opt->use_image_storage;
    opt_g.use_bf16_storage = opt->use_bf16_storage;
    opt_g._37_3_ = *(undefined3 *)&opt->field_0x25;
    opt_g.lightmode = opt->lightmode;
    opt_g._1_3_ = *(undefined3 *)&opt->field_0x1;
    opt_g.num_threads = opt->num_threads;
    opt_g.workspace_allocator = opt->workspace_allocator;
    opt_g.use_winograd_convolution = opt->use_winograd_convolution;
    opt_g.use_sgemm_convolution = opt->use_sgemm_convolution;
    opt_g.use_int8_inference = opt->use_int8_inference;
    opt_g.use_vulkan_compute = opt->use_vulkan_compute;
    opt_g.use_fp16_packed = opt->use_fp16_packed;
    opt_g.use_fp16_storage = opt->use_fp16_storage;
    opt_g.use_fp16_arithmetic = opt->use_fp16_arithmetic;
    opt_g.use_int8_storage = opt->use_int8_storage;
    opt_g.blob_allocator = opt->workspace_allocator;
    quantize_float32_to_int8
              (bottom_blob,&bottom_blob_unbordered,
               *(float *)(&this->field_0x1f8 + (long)this->_vptr_Convolution_x86[-3]),&opt_g);
  }
  bottom_blob_bordered.elemsize._0_4_ = 0;
  bottom_blob_bordered.elemsize._4_4_ = 0;
  bottom_blob_bordered.elempack = 0;
  bottom_blob_bordered.data = (void *)0x0;
  bottom_blob_bordered.refcount._0_4_ = 0;
  bottom_blob_bordered.refcount._4_4_ = 0;
  bottom_blob_bordered.allocator = (Allocator *)0x0;
  bottom_blob_bordered.dims = 0;
  bottom_blob_bordered.w = 0;
  bottom_blob_bordered.h = 0;
  bottom_blob_bordered.c = 0;
  bottom_blob_bordered.cstep = 0;
  Convolution::make_padding
            ((Convolution *)
             ((long)&this->_vptr_Convolution_x86 + (long)this->_vptr_Convolution_x86[-3]),
             &bottom_blob_unbordered,&bottom_blob_bordered,opt);
  iVar45 = -100;
  if ((bottom_blob_bordered.data != (void *)0x0) &&
     ((long)bottom_blob_bordered.c * bottom_blob_bordered.cstep != 0)) {
    p_Var20 = this->_vptr_Convolution_x86[-3];
    iVar63 = (~((iVar63 + -1) * iVar28) + bottom_blob_bordered.w) /
             *(int *)(p_Var20 + 0xc + (long)&(this->weight_3x3_winograd23_data_int8).data) + 1;
    iVar28 = (~((iVar32 + -1) * iVar57) + bottom_blob_bordered.h) /
             *(int *)(p_Var20 + 0x10 + (long)&(this->weight_3x3_winograd23_data_int8).data) + 1;
    Mat::create(top_blob,iVar63,iVar28,*(int *)(&this->use_winograd3x3_int8 + (long)p_Var20),
                ((ulong)(byte)(&this->field_0x200)[(long)p_Var20] ^ 1) * 3 + 1,opt->blob_allocator);
    if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
      pp_Var33 = this->_vptr_Convolution_x86;
      if ((&this->field_0x200)[(long)pp_Var33[-3]] == '\x01') {
        top_blob_tm.elemsize._0_4_ = 0;
        top_blob_tm.elemsize._4_4_ = 0;
        top_blob_tm.elempack = 0;
        top_blob_tm.data = (void *)0x0;
        top_blob_tm.refcount._0_4_ = 0;
        top_blob_tm.refcount._4_4_ = 0;
        top_blob_tm.allocator = (Allocator *)0x0;
        top_blob_tm.dims = 0;
        top_blob_tm.w = 0;
        top_blob_tm.h = 0;
        top_blob_tm.c = 0;
        top_blob_tm.cstep = 0;
        Mat::create(&top_blob_tm,iVar63,iVar28,
                    *(int *)(&this->use_winograd3x3_int8 + (long)pp_Var33[-3]),4,
                    opt->workspace_allocator);
        if ((top_blob_tm.data == (void *)0x0) || ((long)top_blob_tm.c * top_blob_tm.cstep == 0)) {
          Mat::~Mat(&top_blob_tm);
          goto LAB_0013e021;
        }
        if (this->use_winograd3x3_int8 == true) {
          conv3x3s1_winograd23_int8_sse
                    (&bottom_blob_bordered,&top_blob_tm,&this->weight_3x3_winograd23_data_int8,opt);
          lVar68 = 0;
          for (lVar66 = 0;
              lVar66 < *(int *)(&this->use_winograd3x3_int8 + (long)this->_vptr_Convolution_x86[-3])
              ; lVar66 = lVar66 + 1) {
            uVar22._0_1_ = opt->lightmode;
            uVar22._1_3_ = *(undefined3 *)&opt->field_0x1;
            uVar22._4_4_ = opt->num_threads;
            opt_g_1.workspace_allocator = opt->workspace_allocator;
            opt_g_1.use_winograd_convolution = opt->use_winograd_convolution;
            opt_g_1.use_sgemm_convolution = opt->use_sgemm_convolution;
            opt_g_1.use_int8_inference = opt->use_int8_inference;
            opt_g_1.use_vulkan_compute = opt->use_vulkan_compute;
            opt_g_1.use_fp16_packed = opt->use_fp16_packed;
            opt_g_1.use_fp16_storage = opt->use_fp16_storage;
            opt_g_1.use_fp16_arithmetic = opt->use_fp16_arithmetic;
            opt_g_1.use_int8_storage = opt->use_int8_storage;
            opt_g_1.use_int8_arithmetic = opt->use_int8_arithmetic;
            opt_g_1.use_packing_layout = opt->use_packing_layout;
            opt_g_1.use_shader_pack8 = opt->use_shader_pack8;
            opt_g_1.use_image_storage = opt->use_image_storage;
            opt_g_1.use_bf16_storage = opt->use_bf16_storage;
            opt_g_1._37_3_ = *(undefined3 *)&opt->field_0x25;
            opt_g_1._0_4_ = SUB84(uVar22,0);
            opt_g_1.num_threads = 1;
            opt_g_1.blob_allocator = top_blob->allocator;
            Mat::channel_range((Mat *)&opt_g,&top_blob_tm,(int)lVar66,1);
            Mat::channel_range(&top_blob_g,top_blob,(int)lVar66,1);
            p_Var20 = this->_vptr_Convolution_x86[-3];
            fVar72 = *(float *)(*(long *)(&this->field_0x1b8 + (long)p_Var20) + lVar68);
            fVar71 = 0.0;
            if (fVar72 != 0.0) {
              fVar71 = 1.0 / (fVar72 * *(float *)(&this->field_0x1f8 + (long)p_Var20));
            }
            if (*(int *)(p_Var20 + 0x28 + (long)&(this->weight_3x3_winograd23_data_int8).data) == 0)
            {
              pfVar46 = (float *)0x0;
            }
            else {
              pfVar46 = (float *)(*(long *)(&this->field_0x178 + (long)p_Var20) + lVar68);
            }
            requantize_int8_to_int8
                      ((Mat *)&opt_g,&top_blob_g,fVar71,
                       *(float *)(&this->field_0x1fc + (long)p_Var20),pfVar46,
                       (uint)(*(int *)(p_Var20 + 0x28 +
                                      (long)&(this->weight_3x3_winograd23_data_int8).data) != 0),0,
                       &opt_g_1);
            Mat::~Mat(&top_blob_g);
            Mat::~Mat((Mat *)&opt_g);
            lVar68 = lVar68 + 4;
          }
        }
        else {
          requantize_scales.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          requantize_scales.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          requantize_scales.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          for (lVar66 = 0; p_Var20 = this->_vptr_Convolution_x86[-3],
              lVar66 < *(int *)(&this->use_winograd3x3_int8 + (long)p_Var20); lVar66 = lVar66 + 1) {
            fVar72 = *(float *)(*(long *)(&this->field_0x1b8 + (long)p_Var20) + lVar66 * 4);
            fVar71 = 0.0;
            if (fVar72 != 0.0) {
              fVar71 = 1.0 / (fVar72 * *(float *)(&this->field_0x1f8 + (long)p_Var20));
            }
            opt_g._0_4_ = fVar71;
            top_blob_g.data =
                 (void *)CONCAT44(top_blob_g.data._4_4_,
                                  *(undefined4 *)(&this->field_0x1fc + (long)p_Var20));
            std::vector<float,_std::allocator<float>_>::push_back
                      (&requantize_scales,(value_type_conflict2 *)&opt_g);
            std::vector<float,_std::allocator<float>_>::push_back
                      (&requantize_scales,(value_type_conflict2 *)&top_blob_g);
          }
          uVar64 = *(uint *)(&this->field_0xbc + (long)p_Var20);
          iVar28 = *(int *)(p_Var20 + (long)&(this->weight_3x3_winograd23_data_int8).data);
          iVar57 = *(int *)(p_Var20 + 0xc + (long)&(this->weight_3x3_winograd23_data_int8).data);
          iVar63 = *(int *)(p_Var20 + 0x10 + (long)&(this->weight_3x3_winograd23_data_int8).data);
          std::vector<float,_std::allocator<float>_>::vector
                    ((vector<float,_std::allocator<float>_> *)&local_d0,&requantize_scales);
          iVar26 = bottom_blob_bordered.w;
          iVar65 = bottom_blob_bordered.c;
          iVar32 = top_blob->w;
          iVar45 = top_blob->h;
          iVar53 = top_blob->c;
          uVar34 = (ulong)iVar53;
          lVar66 = *(long *)(&this->field_0x138 + (long)p_Var20);
          lVar68 = *(long *)(&this->field_0x178 + (long)p_Var20);
          iVar40 = iVar28 * uVar64;
          iVar52 = bottom_blob_bordered.c * iVar40;
          uVar43 = iVar45 * iVar32;
          Mat::Mat((Mat *)&opt_g,iVar52,uVar43,1,opt->workspace_allocator);
          uVar23 = opt_g._0_8_;
          if ((int)uVar64 < 1) {
            uVar64 = 0;
          }
          if (iVar28 < 1) {
            iVar28 = 0;
          }
          uVar35 = 0;
          if (0 < iVar65) {
            uVar35 = (ulong)(uint)iVar65;
          }
          if (iVar32 < 1) {
            iVar32 = 0;
          }
          iVar30 = 0;
          if (iVar45 < 1) {
            iVar45 = 0;
          }
          iVar50 = 0;
          for (iVar41 = 0; iVar41 != iVar45; iVar41 = iVar41 + 1) {
            iVar29 = iVar30;
            for (iVar44 = 0; iVar44 != iVar32; iVar44 = iVar44 + 1) {
              for (uVar55 = 0; uVar55 != uVar35; uVar55 = uVar55 + 1) {
                top_blob_g.elemsize =
                     CONCAT44(bottom_blob_bordered.elemsize._4_4_,
                              (undefined4)bottom_blob_bordered.elemsize);
                pvVar60 = (void *)(bottom_blob_bordered.cstep * uVar55 * top_blob_g.elemsize +
                                  (long)bottom_blob_bordered.data);
                top_blob_g.refcount = (int *)0x0;
                top_blob_g.elempack = bottom_blob_bordered.elempack;
                top_blob_g.allocator = bottom_blob_bordered.allocator;
                top_blob_g.dims = 2;
                top_blob_g.w = bottom_blob_bordered.w;
                top_blob_g.h = bottom_blob_bordered.h;
                top_blob_g.c = 1;
                top_blob_g.cstep = (size_t)(bottom_blob_bordered.h * bottom_blob_bordered.w);
                top_blob_g.data = pvVar60;
                Mat::~Mat(&top_blob_g);
                iVar39 = iVar29;
                for (iVar31 = 0; iVar31 != iVar28; iVar31 = iVar31 + 1) {
                  for (uVar54 = 0; uVar64 != uVar54; uVar54 = uVar54 + 1) {
                    *(undefined1 *)((long)iVar50 + uVar23 + uVar54) =
                         *(undefined1 *)((long)pvVar60 + (long)(iVar39 + (int)uVar54));
                  }
                  iVar50 = iVar50 + (int)uVar54;
                  iVar39 = iVar39 + iVar26;
                }
              }
              iVar29 = iVar29 + iVar57;
            }
            iVar30 = iVar30 + iVar63 * iVar26;
          }
          Mat::Mat(&top_blob_g,iVar40 * 4,iVar65,((int)uVar43 / 4) * -3 + uVar43,1,
                   opt->workspace_allocator);
          local_320 = 1;
          uVar55 = 0;
          uVar35 = (ulong)(uint)((int)uVar43 >> 2);
          if ((int)uVar43 >> 2 < 1) {
            uVar35 = uVar55;
          }
          lVar61 = 3;
          lVar58 = 2;
          for (uVar54 = 0; pAVar24 = opt_g.workspace_allocator, uVar22 = opt_g._0_8_,
              sVar25 = top_blob_g.cstep, uVar23 = top_blob_g._24_8_, sVar19 = top_blob_g.elemsize,
              pvVar60 = top_blob_g.data, uVar54 != uVar35; uVar54 = uVar54 + 1) {
            lVar36 = (long)local_17c;
            opt_g_1._0_8_ = top_blob_g.cstep * uVar54 * top_blob_g.elemsize + (long)top_blob_g.data;
            opt_g_1.blob_allocator = (Allocator *)0x0;
            opt_g_1.workspace_allocator = (Allocator *)top_blob_g.elemsize;
            opt_g_1.use_winograd_convolution = (bool)(undefined1)top_blob_g.elempack;
            opt_g_1.use_sgemm_convolution = (bool)top_blob_g.elempack._1_1_;
            opt_g_1.use_int8_inference = (bool)top_blob_g.elempack._2_1_;
            opt_g_1.use_vulkan_compute = (bool)top_blob_g.elempack._3_1_;
            opt_g_1._32_8_ = top_blob_g.allocator;
            local_2b0 = (size_t)(top_blob_g.h * top_blob_g.w);
            top_blob_g._24_8_ = uVar23;
            Mat::~Mat((Mat *)&opt_g_1);
            lVar67 = sVar25 * sVar19 * uVar54;
            lVar37 = (long)pAVar24 * lVar61 * lVar36 + uVar22;
            lVar42 = (long)pAVar24 * lVar58 * lVar36 + uVar22;
            lVar47 = (long)pAVar24 * local_320 * lVar36 + uVar22;
            lVar36 = (long)pAVar24 * uVar55 * lVar36 + uVar22;
            for (lVar56 = 0; (int)lVar56 + 1 < iVar52; lVar56 = lVar56 + 2) {
              *(undefined1 *)((long)pvVar60 + lVar56 * 4 + lVar67) =
                   *(undefined1 *)(lVar36 + lVar56);
              *(undefined1 *)((long)pvVar60 + lVar56 * 4 + lVar67 + 1) =
                   *(undefined1 *)(lVar36 + 1 + lVar56);
              *(undefined1 *)((long)pvVar60 + lVar56 * 4 + lVar67 + 2) =
                   *(undefined1 *)(lVar47 + lVar56);
              *(undefined1 *)((long)pvVar60 + lVar56 * 4 + lVar67 + 3) =
                   *(undefined1 *)(lVar47 + 1 + lVar56);
              *(undefined1 *)((long)pvVar60 + lVar56 * 4 + lVar67 + 4) =
                   *(undefined1 *)(lVar42 + lVar56);
              *(undefined1 *)((long)pvVar60 + lVar56 * 4 + lVar67 + 5) =
                   *(undefined1 *)(lVar42 + 1 + lVar56);
              *(undefined1 *)((long)pvVar60 + lVar56 * 4 + lVar67 + 6) =
                   *(undefined1 *)(lVar37 + lVar56);
              *(undefined1 *)((long)pvVar60 + lVar56 * 4 + lVar67 + 7) =
                   *(undefined1 *)(lVar37 + 1 + lVar56);
            }
            for (; (int)lVar56 < iVar52; lVar56 = lVar56 + 1) {
              *(undefined1 *)((long)pvVar60 + lVar56 * 4 + lVar67) =
                   *(undefined1 *)(lVar36 + lVar56);
              *(undefined1 *)((long)pvVar60 + lVar56 * 4 + lVar67 + 1) =
                   *(undefined1 *)(lVar47 + lVar56);
              *(undefined1 *)((long)pvVar60 + lVar56 * 4 + lVar67 + 2) =
                   *(undefined1 *)(lVar42 + lVar56);
              *(undefined1 *)((long)pvVar60 + lVar56 * 4 + lVar67 + 3) =
                   *(undefined1 *)(lVar37 + lVar56);
            }
            lVar61 = lVar61 + 4;
            lVar58 = lVar58 + 4;
            local_320 = local_320 + 4;
            uVar55 = uVar55 + 4;
          }
          for (uVar64 = uVar43 & 0xfffffffc; pAVar24 = opt_g.workspace_allocator,
              uVar22 = opt_g._0_8_, uVar23 = top_blob_g._24_8_, (int)uVar64 < (int)uVar43;
              uVar64 = uVar64 + 1) {
            pvVar60 = (void *)((long)((int)uVar64 % 4 + (int)uVar64 / 4) * top_blob_g.cstep *
                               top_blob_g.elemsize + (long)top_blob_g.data);
            opt_g_1.blob_allocator = (Allocator *)0x0;
            opt_g_1.workspace_allocator = (Allocator *)top_blob_g.elemsize;
            opt_g_1.use_winograd_convolution = (bool)(undefined1)top_blob_g.elempack;
            opt_g_1.use_sgemm_convolution = (bool)top_blob_g.elempack._1_1_;
            opt_g_1.use_int8_inference = (bool)top_blob_g.elempack._2_1_;
            opt_g_1.use_vulkan_compute = (bool)top_blob_g.elempack._3_1_;
            opt_g_1._32_8_ = top_blob_g.allocator;
            local_2b0 = (size_t)(top_blob_g.h * top_blob_g.w);
            opt_g_1._0_8_ = pvVar60;
            top_blob_g._24_8_ = uVar23;
            Mat::~Mat((Mat *)&opt_g_1);
            lVar61 = (long)(int)(local_17c * uVar64) * (long)pAVar24 + uVar22;
            for (lVar58 = 0; (int)lVar58 + 1 < iVar52; lVar58 = lVar58 + 2) {
              *(undefined1 *)((long)pvVar60 + lVar58) = *(undefined1 *)(lVar61 + lVar58);
              *(undefined1 *)((long)pvVar60 + lVar58 + 1) = *(undefined1 *)(lVar61 + 1 + lVar58);
            }
            for (; (int)lVar58 < iVar52; lVar58 = lVar58 + 1) {
              *(undefined1 *)((long)pvVar60 + lVar58) = *(undefined1 *)(lVar61 + lVar58);
            }
          }
          Mat::Mat((Mat *)&opt_g_1,iVar40 * 4,iVar65,iVar53 / 4 + iVar53 % 4,1,
                   opt->workspace_allocator);
          uVar55 = 0;
          uVar35 = (ulong)(uint)(iVar53 >> 2);
          if (iVar53 >> 2 < 1) {
            uVar35 = uVar55;
          }
          iVar65 = iVar65 * iVar40;
          iVar32 = iVar65 * 4;
          iVar63 = iVar65 * 2;
          iVar28 = iVar65 * 3;
          iVar57 = iVar52;
          for (uVar54 = 0; pAVar24 = opt_g_1.workspace_allocator, uVar23 = opt_g_1._0_8_,
              uVar54 != uVar35; uVar54 = uVar54 + 1) {
            lVar36 = (int)uVar55 + lVar66;
            lVar37 = iVar57 + lVar66;
            sum0._0_8_ = local_2b0 * uVar54 * (long)opt_g_1.workspace_allocator + opt_g_1._0_8_;
            sum0[2] = 0;
            sum0[3] = 0;
            lVar58 = iVar63 + lVar66;
            lVar47 = iVar28 + lVar66;
            Mat::~Mat((Mat *)sum0);
            lVar42 = local_2b0 * (long)pAVar24 * uVar54 + uVar23;
            for (lVar61 = 0; (int)lVar61 + 1 < iVar52; lVar61 = lVar61 + 2) {
              *(undefined1 *)(lVar42 + lVar61 * 4) = *(undefined1 *)(lVar36 + lVar61);
              *(undefined1 *)(lVar42 + 1 + lVar61 * 4) = *(undefined1 *)(lVar36 + 1 + lVar61);
              *(undefined1 *)(lVar42 + 2 + lVar61 * 4) = *(undefined1 *)(lVar37 + lVar61);
              *(undefined1 *)(lVar42 + 3 + lVar61 * 4) = *(undefined1 *)(lVar37 + 1 + lVar61);
              *(undefined1 *)(lVar42 + 4 + lVar61 * 4) = *(undefined1 *)(lVar58 + lVar61);
              *(undefined1 *)(lVar42 + 5 + lVar61 * 4) = *(undefined1 *)(lVar58 + 1 + lVar61);
              *(undefined1 *)(lVar42 + 6 + lVar61 * 4) = *(undefined1 *)(lVar47 + lVar61);
              *(undefined1 *)(lVar42 + 7 + lVar61 * 4) = *(undefined1 *)(lVar47 + 1 + lVar61);
            }
            for (; (int)lVar61 < iVar52; lVar61 = lVar61 + 1) {
              *(undefined1 *)(lVar42 + lVar61 * 4) = *(undefined1 *)(lVar36 + lVar61);
              *(undefined1 *)(lVar42 + 1 + lVar61 * 4) = *(undefined1 *)(lVar37 + lVar61);
              *(undefined1 *)(lVar42 + 2 + lVar61 * 4) = *(undefined1 *)(lVar58 + lVar61);
              *(undefined1 *)(lVar42 + 3 + lVar61 * 4) = *(undefined1 *)(lVar47 + lVar61);
            }
            uVar55 = (ulong)(uint)((int)uVar55 + iVar32);
            iVar57 = iVar57 + iVar32;
            iVar63 = iVar63 + iVar32;
            iVar28 = iVar28 + iVar32;
          }
          iVar28 = iVar65 * ((uint)(uVar34 >> 2) & 0x3fffffff) * 4;
          uVar54 = uVar34 & 0xfffffffffffffffc;
          for (uVar55 = uVar54; (long)uVar55 < (long)uVar34; uVar55 = uVar55 + 1) {
            uVar38 = (ulong)(uint)((int)uVar55 >> 0x1f) << 0x20 | uVar55 & 0xffffffff;
            lVar36 = iVar28 + lVar66;
            lVar58 = (long)((int)((long)uVar38 % 4) + (int)((long)uVar38 / 4)) * local_2b0 *
                     (long)opt_g_1.workspace_allocator + opt_g_1._0_8_;
            sum0[2] = 0;
            sum0[3] = 0;
            sum0._0_8_ = lVar58;
            Mat::~Mat((Mat *)sum0);
            for (lVar61 = 0; (int)lVar61 + 1 < iVar52; lVar61 = lVar61 + 2) {
              *(undefined1 *)(lVar58 + lVar61) = *(undefined1 *)(lVar36 + lVar61);
              *(undefined1 *)(lVar58 + 1 + lVar61) = *(undefined1 *)(lVar36 + 1 + lVar61);
            }
            for (; (int)lVar61 < iVar52; lVar61 = lVar61 + 1) {
              *(undefined1 *)(lVar58 + lVar61) = *(undefined1 *)(lVar36 + lVar61);
            }
            iVar28 = iVar28 + iVar52;
          }
          for (uVar55 = 0; uVar55 != uVar35; uVar55 = uVar55 + 1) {
            uVar38 = uVar55 * 4;
            Mat::channel((Mat *)sum0,top_blob,(uint)uVar38);
            puVar59 = (undefined1 *)sum0._0_8_;
            Mat::~Mat((Mat *)sum0);
            uVar62 = uVar38 | 1;
            Mat::channel((Mat *)sum0,top_blob,(uint)uVar38 | 1);
            local_300 = (undefined1 *)sum0._0_8_;
            Mat::~Mat((Mat *)sum0);
            uVar48 = uVar38 | 2;
            Mat::channel((Mat *)sum0,top_blob,(int)uVar48);
            local_310 = (undefined1 *)sum0._0_8_;
            Mat::~Mat((Mat *)sum0);
            uVar38 = uVar38 | 3;
            Mat::channel((Mat *)sum0,top_blob,(int)uVar38);
            local_318 = (undefined1 *)sum0._0_8_;
            Mat::~Mat((Mat *)sum0);
            if (lVar68 == 0) {
              fVar73 = 0.0;
              fVar2 = 0.0;
              fVar72 = 0.0;
              fVar71 = 0.0;
            }
            else {
              fVar72 = *(float *)(lVar68 + uVar55 * 0x10);
              fVar71 = *(float *)(lVar68 + uVar62 * 4);
              fVar2 = *(float *)(lVar68 + uVar48 * 4);
              fVar73 = *(float *)(lVar68 + uVar38 * 4);
            }
            fVar3 = local_d0._M_impl.super__Vector_impl_data._M_start[uVar55 * 8];
            fVar4 = local_d0._M_impl.super__Vector_impl_data._M_start[uVar55 * 8 + 1];
            fVar5 = local_d0._M_impl.super__Vector_impl_data._M_start[uVar62 * 2];
            fVar6 = local_d0._M_impl.super__Vector_impl_data._M_start[uVar62 * 2 + 1];
            fVar7 = local_d0._M_impl.super__Vector_impl_data._M_start[uVar48 * 2];
            fVar8 = local_d0._M_impl.super__Vector_impl_data._M_start[uVar48 * 2 + 1];
            fVar9 = local_d0._M_impl.super__Vector_impl_data._M_start[uVar38 * 2];
            fVar10 = local_d0._M_impl.super__Vector_impl_data._M_start[uVar38 * 2 + 1];
            for (uVar38 = 0; (long)(uVar38 | 3) < (long)(int)uVar43; uVar38 = uVar38 + 4) {
              pvVar60 = (void *)((uVar38 >> 2) * top_blob_g.cstep * top_blob_g.elemsize +
                                (long)top_blob_g.data);
              sum0[2] = 0;
              sum0[3] = 0;
              sum0._0_8_ = pvVar60;
              Mat::~Mat((Mat *)sum0);
              pcVar70 = (char *)(local_2b0 * uVar55 * (long)opt_g_1.workspace_allocator +
                                opt_g_1._0_8_);
              sum0[2] = 0;
              sum0[3] = 0;
              sum0._0_8_ = pcVar70;
              Mat::~Mat((Mat *)sum0);
              sum0[0] = 0;
              sum0[1] = 0;
              sum0[2] = 0;
              sum0[3] = 0;
              sum1[0] = 0;
              sum1[1] = 0;
              sum1[2] = 0;
              sum1[3] = 0;
              sum2[0] = 0;
              sum2[1] = 0;
              sum2[2] = 0;
              sum2[3] = 0;
              sum3[0] = 0;
              sum3[1] = 0;
              sum3[2] = 0;
              sum3[3] = 0;
              for (uVar64 = 0; (int)(uVar64 | 1) < iVar52; uVar64 = uVar64 + 2) {
                cVar11 = *pcVar70;
                cVar12 = pcVar70[1];
                cVar13 = pcVar70[2];
                cVar14 = pcVar70[3];
                cVar15 = pcVar70[4];
                cVar16 = pcVar70[5];
                cVar17 = pcVar70[6];
                cVar18 = pcVar70[7];
                for (lVar66 = 0; lVar66 != 8; lVar66 = lVar66 + 2) {
                  iVar28 = (int)*(char *)((long)pvVar60 + lVar66);
                  iVar57 = (int)*(char *)((long)pvVar60 + lVar66 + 1);
                  *(int *)((long)sum0 + lVar66 * 2) =
                       iVar57 * cVar12 + iVar28 * cVar11 + *(int *)((long)sum0 + lVar66 * 2);
                  piVar1 = (int *)((long)sum2 + lVar66 * 2);
                  *piVar1 = *piVar1 + iVar57 * cVar16 + iVar28 * cVar15;
                  *(int *)((long)sum1 + lVar66 * 2) =
                       iVar57 * cVar14 + iVar28 * cVar13 + *(int *)((long)sum1 + lVar66 * 2);
                  piVar1 = (int *)((long)sum3 + lVar66 * 2);
                  *piVar1 = *piVar1 + iVar57 * cVar18 + iVar28 * cVar17;
                }
                pcVar70 = pcVar70 + 8;
                pvVar60 = (void *)((long)pvVar60 + 8);
              }
              for (; (int)uVar64 < iVar52; uVar64 = uVar64 + 1) {
                cVar11 = *pcVar70;
                cVar12 = pcVar70[1];
                cVar13 = pcVar70[2];
                cVar14 = pcVar70[3];
                for (lVar66 = 0; lVar66 != 4; lVar66 = lVar66 + 1) {
                  iVar28 = (int)*(char *)((long)pvVar60 + lVar66);
                  sum0[lVar66] = sum0[lVar66] + iVar28 * cVar11;
                  sum1[lVar66] = sum1[lVar66] + iVar28 * cVar12;
                  sum2[lVar66] = sum2[lVar66] + iVar28 * cVar13;
                  sum3[lVar66] = sum3[lVar66] + iVar28 * cVar14;
                }
                pcVar70 = pcVar70 + 4;
                pvVar60 = (void *)((long)pvVar60 + 4);
              }
              for (lVar66 = 0; lVar66 != 4; lVar66 = lVar66 + 1) {
                fVar74 = roundf(((float)sum0[lVar66] * fVar3 + fVar72) * fVar4);
                iVar28 = (int)fVar74;
                if ((int)fVar74 < -0x7e) {
                  iVar28 = -0x7f;
                }
                uVar27 = (undefined1)iVar28;
                if (0x7e < iVar28) {
                  uVar27 = 0x7f;
                }
                puVar59[lVar66] = uVar27;
                fVar74 = roundf(((float)sum1[lVar66] * fVar5 + fVar71) * fVar6);
                iVar28 = (int)fVar74;
                if (iVar28 < -0x7e) {
                  iVar28 = -0x7f;
                }
                uVar27 = (undefined1)iVar28;
                if (0x7e < iVar28) {
                  uVar27 = 0x7f;
                }
                local_300[lVar66] = uVar27;
                fVar74 = roundf(((float)sum2[lVar66] * fVar7 + fVar2) * fVar8);
                iVar28 = (int)fVar74;
                if (iVar28 < -0x7e) {
                  iVar28 = -0x7f;
                }
                uVar27 = (undefined1)iVar28;
                if (0x7e < iVar28) {
                  uVar27 = 0x7f;
                }
                local_310[lVar66] = uVar27;
                fVar74 = roundf(((float)sum3[lVar66] * fVar9 + fVar73) * fVar10);
                iVar28 = (int)fVar74;
                if (iVar28 < -0x7e) {
                  iVar28 = -0x7f;
                }
                uVar27 = (undefined1)iVar28;
                if (0x7e < iVar28) {
                  uVar27 = 0x7f;
                }
                local_318[lVar66] = uVar27;
              }
              puVar59 = puVar59 + 4;
              local_300 = local_300 + 4;
              local_310 = local_310 + 4;
              local_318 = local_318 + 4;
            }
            while (pvVar60 = top_blob_g.data, uVar64 = (uint)uVar38, (int)uVar64 < (int)uVar43) {
              uVar38 = (ulong)((uVar64 & 3) + ((uint)(uVar38 >> 2) & 0x3fffffff));
              lVar58 = top_blob_g.cstep * top_blob_g.elemsize;
              sum0._0_8_ = uVar38 * lVar58 + (long)top_blob_g.data;
              sum0[2] = 0;
              sum0[3] = 0;
              Mat::~Mat((Mat *)sum0);
              uVar23 = opt_g_1._0_8_;
              lVar61 = local_2b0 * uVar55 * (long)opt_g_1.workspace_allocator;
              pcVar70 = (char *)(lVar61 + opt_g_1._0_8_);
              sum0[2] = 0;
              sum0[3] = 0;
              sum0._0_8_ = pcVar70;
              Mat::~Mat((Mat *)sum0);
              lVar58 = lVar58 * uVar38;
              iVar28 = 0;
              iVar63 = 0;
              iVar57 = 0;
              iVar32 = 0;
              for (lVar66 = 0; (int)lVar66 + 1 < iVar52; lVar66 = lVar66 + 2) {
                iVar45 = (int)*(char *)((long)pvVar60 + lVar66 + lVar58);
                iVar53 = (int)*(char *)((long)pvVar60 + lVar66 + lVar58 + 1);
                iVar28 = pcVar70[1] * iVar53 + *pcVar70 * iVar45 + iVar28;
                iVar63 = pcVar70[3] * iVar53 + pcVar70[2] * iVar45 + iVar63;
                iVar57 = pcVar70[5] * iVar53 + pcVar70[4] * iVar45 + iVar57;
                iVar32 = pcVar70[7] * iVar53 + pcVar70[6] * iVar45 + iVar32;
                pcVar70 = pcVar70 + 8;
              }
              lVar61 = uVar23 + lVar61;
              for (; (int)lVar66 < iVar52; lVar66 = lVar66 + 1) {
                iVar45 = (int)*(char *)((long)pvVar60 + lVar66 + lVar58);
                iVar28 = iVar28 + *(char *)(lVar61 + lVar66 * 4) * iVar45;
                iVar63 = iVar63 + *(char *)(lVar61 + 1 + lVar66 * 4) * iVar45;
                iVar57 = iVar57 + *(char *)(lVar61 + 2 + lVar66 * 4) * iVar45;
                iVar32 = iVar32 + *(char *)(lVar61 + 3 + lVar66 * 4) * iVar45;
              }
              fVar74 = roundf(((float)iVar28 * fVar3 + fVar72) * fVar4);
              iVar28 = (int)fVar74;
              if ((int)fVar74 < -0x7e) {
                iVar28 = -0x7f;
              }
              uVar27 = (undefined1)iVar28;
              if (0x7e < iVar28) {
                uVar27 = 0x7f;
              }
              *puVar59 = uVar27;
              fVar74 = roundf(((float)iVar63 * fVar5 + fVar71) * fVar6);
              iVar28 = (int)fVar74;
              if ((int)fVar74 < -0x7e) {
                iVar28 = -0x7f;
              }
              uVar27 = (undefined1)iVar28;
              if (0x7e < iVar28) {
                uVar27 = 0x7f;
              }
              *local_300 = uVar27;
              fVar74 = roundf(((float)iVar57 * fVar7 + fVar2) * fVar8);
              iVar28 = (int)fVar74;
              if (iVar28 < -0x7e) {
                iVar28 = -0x7f;
              }
              uVar27 = (undefined1)iVar28;
              if (0x7e < iVar28) {
                uVar27 = 0x7f;
              }
              *local_310 = uVar27;
              fVar74 = roundf(((float)iVar32 * fVar9 + fVar73) * fVar10);
              iVar28 = (int)fVar74;
              if ((int)fVar74 < -0x7e) {
                iVar28 = -0x7f;
              }
              uVar27 = (undefined1)iVar28;
              if (0x7e < iVar28) {
                uVar27 = 0x7f;
              }
              *local_318 = uVar27;
              puVar59 = puVar59 + 1;
              local_300 = local_300 + 1;
              local_310 = local_310 + 1;
              local_318 = local_318 + 1;
              uVar38 = (ulong)(uVar64 + 1);
            }
          }
          iVar28 = 0;
          if (0 < iVar52) {
            iVar28 = iVar52;
          }
          for (; (long)uVar54 < (long)uVar34; uVar54 = uVar54 + 1) {
            iVar57 = (int)uVar54;
            Mat::channel((Mat *)sum0,top_blob,iVar57);
            puVar59 = (undefined1 *)sum0._0_8_;
            Mat::~Mat((Mat *)sum0);
            if (lVar68 == 0) {
              fVar72 = 0.0;
            }
            else {
              fVar72 = *(float *)(lVar68 + uVar54 * 4);
            }
            fVar71 = local_d0._M_impl.super__Vector_impl_data._M_start[uVar54 * 2];
            fVar2 = local_d0._M_impl.super__Vector_impl_data._M_start[uVar54 * 2 + 1];
            iVar63 = (int)((long)((ulong)(uint)(iVar57 >> 0x1f) << 0x20 | uVar54 & 0xffffffff) / 4);
            lVar66 = (long)(iVar63 * -3 + iVar57);
            for (uVar35 = 0; (long)(uVar35 | 3) < (long)(int)uVar43; uVar35 = uVar35 + 4) {
              pvVar60 = (void *)((uVar35 >> 2) * top_blob_g.cstep * top_blob_g.elemsize +
                                (long)top_blob_g.data);
              sum0[2] = 0;
              sum0[3] = 0;
              sum0._0_8_ = pvVar60;
              Mat::~Mat((Mat *)sum0);
              pcVar70 = (char *)(local_2b0 * lVar66 * (long)opt_g_1.workspace_allocator +
                                opt_g_1._0_8_);
              sum0[2] = 0;
              sum0[3] = 0;
              sum0._0_8_ = pcVar70;
              Mat::~Mat((Mat *)sum0);
              sum0[0] = 0;
              sum0[1] = 0;
              sum0[2] = 0;
              sum0[3] = 0;
              for (uVar64 = 0; (int)(uVar64 | 1) < iVar52; uVar64 = uVar64 + 2) {
                cVar11 = *pcVar70;
                cVar12 = pcVar70[1];
                for (lVar61 = 0; lVar61 != 4; lVar61 = lVar61 + 1) {
                  sum0[lVar61] = (int)*(char *)((long)pvVar60 + lVar61 * 2 + 1) * (int)cVar12 +
                                 (int)*(char *)((long)pvVar60 + lVar61 * 2) * (int)cVar11 +
                                 sum0[lVar61];
                }
                pcVar70 = pcVar70 + 2;
                pvVar60 = (void *)((long)pvVar60 + 8);
              }
              for (; (int)uVar64 < iVar52; uVar64 = uVar64 + 1) {
                cVar11 = *pcVar70;
                for (lVar61 = 0; lVar61 != 4; lVar61 = lVar61 + 1) {
                  sum0[lVar61] = sum0[lVar61] + (int)*(char *)((long)pvVar60 + lVar61) * (int)cVar11
                  ;
                }
                pcVar70 = pcVar70 + 1;
                pvVar60 = (void *)((long)pvVar60 + 4);
              }
              for (lVar61 = 0; lVar61 != 4; lVar61 = lVar61 + 1) {
                fVar73 = roundf(((float)sum0[lVar61] * fVar71 + fVar72) * fVar2);
                iVar32 = (int)fVar73;
                if (iVar32 < -0x7e) {
                  iVar32 = -0x7f;
                }
                if (0x7e < iVar32) {
                  iVar32 = 0x7f;
                }
                puVar59[lVar61] = (char)iVar32;
              }
              puVar59 = puVar59 + 4;
            }
            while (pvVar60 = top_blob_g.data, uVar64 = (uint)uVar35, (int)uVar64 < (int)uVar43) {
              uVar35 = (ulong)((uVar64 & 3) + ((uint)(uVar35 >> 2) & 0x3fffffff));
              lVar58 = top_blob_g.cstep * top_blob_g.elemsize;
              sum0._0_8_ = uVar35 * lVar58 + (long)top_blob_g.data;
              sum0[2] = 0;
              sum0[3] = 0;
              Mat::~Mat((Mat *)sum0);
              pAVar24 = opt_g_1.workspace_allocator;
              uVar23 = opt_g_1._0_8_;
              sum0._0_8_ = local_2b0 * lVar66 * (long)opt_g_1.workspace_allocator + opt_g_1._0_8_;
              sum0[2] = 0;
              sum0[3] = 0;
              Mat::~Mat((Mat *)sum0);
              iVar32 = 0;
              for (lVar61 = 0; iVar28 != (int)lVar61; lVar61 = lVar61 + 1) {
                iVar32 = iVar32 + (int)*(char *)((long)pvVar60 + lVar61 + lVar58 * uVar35) *
                                  (int)*(char *)(local_2b0 * (long)(iVar57 + iVar63 * -3) *
                                                 (long)pAVar24 + uVar23 + lVar61);
              }
              fVar73 = roundf(((float)iVar32 * fVar71 + fVar72) * fVar2);
              iVar32 = (int)fVar73;
              if (iVar32 < -0x7e) {
                iVar32 = -0x7f;
              }
              uVar27 = (undefined1)iVar32;
              if (0x7e < iVar32) {
                uVar27 = 0x7f;
              }
              *puVar59 = uVar27;
              puVar59 = puVar59 + 1;
              uVar35 = (ulong)(uVar64 + 1);
            }
          }
          Mat::~Mat((Mat *)&opt_g_1);
          Mat::~Mat(&top_blob_g);
          Mat::~Mat((Mat *)&opt_g);
          std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base(&local_d0);
          std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                    (&requantize_scales.super__Vector_base<float,_std::allocator<float>_>);
        }
        Mat::~Mat(&top_blob_tm);
      }
      else if (this->use_winograd3x3_int8 == true) {
        conv3x3s1_winograd23_int8_sse
                  (&bottom_blob_bordered,top_blob,&this->weight_3x3_winograd23_data_int8,opt);
        lVar66 = 0;
        for (lVar68 = 0;
            lVar68 < *(int *)(&this->use_winograd3x3_int8 + (long)this->_vptr_Convolution_x86[-3]);
            lVar68 = lVar68 + 1) {
          uVar23._0_1_ = opt->lightmode;
          uVar23._1_3_ = *(undefined3 *)&opt->field_0x1;
          uVar23._4_4_ = opt->num_threads;
          top_blob_g.elemsize = (size_t)opt->workspace_allocator;
          top_blob_g._24_8_ = *(undefined8 *)&opt->use_winograd_convolution;
          top_blob_g.allocator = *(Allocator **)&opt->use_int8_arithmetic;
          top_blob_g.data = (void *)CONCAT44(1,(int)uVar23);
          top_blob_g.refcount = (int *)top_blob->allocator;
          Mat::channel_range((Mat *)&opt_g,top_blob,(int)lVar68,1);
          p_Var20 = this->_vptr_Convolution_x86[-3];
          fVar72 = *(float *)(*(long *)(&this->field_0x1b8 + (long)p_Var20) + lVar66);
          fVar71 = 0.0;
          if (fVar72 != 0.0) {
            fVar71 = 1.0 / (fVar72 * *(float *)(&this->field_0x1f8 + (long)p_Var20));
          }
          if (*(int *)(p_Var20 + 0x28 + (long)&(this->weight_3x3_winograd23_data_int8).data) == 0) {
            pfVar46 = (float *)0x0;
          }
          else {
            pfVar46 = (float *)(*(long *)(&this->field_0x178 + (long)p_Var20) + lVar66);
          }
          dequantize_int32_to_float32
                    ((Mat *)&opt_g,fVar71,pfVar46,
                     (uint)(*(int *)(p_Var20 + 0x28 +
                                    (long)&(this->weight_3x3_winograd23_data_int8).data) != 0),
                     (Option *)&top_blob_g);
          Mat::~Mat((Mat *)&opt_g);
          lVar66 = lVar66 + 4;
        }
      }
      else {
        local_240 = 3;
        local_250 = 2;
        top_blob_tm.elemsize._0_4_ = 0;
        top_blob_tm.elemsize._4_4_ = 0;
        top_blob_tm.data = (void *)0x0;
        top_blob_tm.refcount._0_4_ = 0;
        top_blob_tm.refcount._4_4_ = 0;
        for (lVar66 = 0; p_Var20 = pp_Var33[-3],
            lVar66 < *(int *)(&this->use_winograd3x3_int8 + (long)p_Var20); lVar66 = lVar66 + 1) {
          fVar72 = *(float *)(*(long *)(&this->field_0x1b8 + (long)p_Var20) + lVar66 * 4);
          fVar71 = 0.0;
          if (fVar72 != 0.0) {
            fVar71 = 1.0 / (fVar72 * *(float *)(&this->field_0x1f8 + (long)p_Var20));
          }
          opt_g._0_4_ = fVar71;
          std::vector<float,_std::allocator<float>_>::push_back
                    ((vector<float,_std::allocator<float>_> *)&top_blob_tm,
                     (value_type_conflict2 *)&opt_g);
          pp_Var33 = this->_vptr_Convolution_x86;
        }
        uVar64 = *(uint *)(&this->field_0xbc + (long)p_Var20);
        iVar28 = *(int *)(p_Var20 + (long)&(this->weight_3x3_winograd23_data_int8).data);
        iVar57 = *(int *)(p_Var20 + 0xc + (long)&(this->weight_3x3_winograd23_data_int8).data);
        iVar63 = *(int *)(p_Var20 + 0x10 + (long)&(this->weight_3x3_winograd23_data_int8).data);
        std::vector<float,_std::allocator<float>_>::vector
                  ((vector<float,_std::allocator<float>_> *)&local_e8,
                   (vector<float,_std::allocator<float>_> *)&top_blob_tm);
        iVar26 = bottom_blob_bordered.w;
        iVar65 = bottom_blob_bordered.c;
        iVar32 = top_blob->w;
        iVar45 = top_blob->h;
        iVar53 = top_blob->c;
        uVar34 = (ulong)iVar53;
        lVar66 = *(long *)(&this->field_0x138 + (long)p_Var20);
        lVar68 = *(long *)(&this->field_0x178 + (long)p_Var20);
        iVar40 = iVar28 * uVar64;
        iVar52 = bottom_blob_bordered.c * iVar40;
        uVar43 = iVar45 * iVar32;
        Mat::Mat((Mat *)&opt_g,iVar52,uVar43,1,opt->workspace_allocator);
        uVar23 = opt_g._0_8_;
        if ((int)uVar64 < 1) {
          uVar64 = 0;
        }
        if (iVar28 < 1) {
          iVar28 = 0;
        }
        uVar35 = 0;
        if (0 < iVar65) {
          uVar35 = (ulong)(uint)iVar65;
        }
        if (iVar32 < 1) {
          iVar32 = 0;
        }
        iVar30 = 0;
        if (iVar45 < 1) {
          iVar45 = 0;
        }
        iVar50 = 0;
        for (iVar41 = 0; iVar41 != iVar45; iVar41 = iVar41 + 1) {
          iVar29 = iVar30;
          for (iVar44 = 0; iVar44 != iVar32; iVar44 = iVar44 + 1) {
            for (uVar55 = 0; uVar55 != uVar35; uVar55 = uVar55 + 1) {
              top_blob_g.elemsize =
                   CONCAT44(bottom_blob_bordered.elemsize._4_4_,
                            (undefined4)bottom_blob_bordered.elemsize);
              pvVar60 = (void *)(bottom_blob_bordered.cstep * uVar55 * top_blob_g.elemsize +
                                (long)bottom_blob_bordered.data);
              top_blob_g.refcount = (int *)0x0;
              top_blob_g.elempack = bottom_blob_bordered.elempack;
              top_blob_g.allocator = bottom_blob_bordered.allocator;
              top_blob_g.dims = 2;
              top_blob_g.w = bottom_blob_bordered.w;
              top_blob_g.h = bottom_blob_bordered.h;
              top_blob_g.c = 1;
              top_blob_g.cstep = (size_t)(bottom_blob_bordered.h * bottom_blob_bordered.w);
              top_blob_g.data = pvVar60;
              Mat::~Mat(&top_blob_g);
              iVar39 = iVar29;
              for (iVar31 = 0; iVar31 != iVar28; iVar31 = iVar31 + 1) {
                for (uVar54 = 0; uVar64 != uVar54; uVar54 = uVar54 + 1) {
                  *(undefined1 *)((long)iVar50 + uVar23 + uVar54) =
                       *(undefined1 *)((long)pvVar60 + (long)(iVar39 + (int)uVar54));
                }
                iVar50 = iVar50 + (int)uVar54;
                iVar39 = iVar39 + iVar26;
              }
            }
            iVar29 = iVar29 + iVar57;
          }
          iVar30 = iVar30 + iVar63 * iVar26;
        }
        Mat::Mat(&top_blob_g,iVar40 * 4,iVar65,((int)uVar43 / 4) * -3 + uVar43,1,
                 opt->workspace_allocator);
        local_320 = 1;
        uVar55 = 0;
        uVar35 = (ulong)(uint)((int)uVar43 >> 2);
        if ((int)uVar43 >> 2 < 1) {
          uVar35 = uVar55;
        }
        for (uVar54 = 0; pAVar24 = opt_g.workspace_allocator, uVar22 = opt_g._0_8_,
            sVar25 = top_blob_g.cstep, uVar23 = top_blob_g._24_8_, sVar19 = top_blob_g.elemsize,
            pvVar60 = top_blob_g.data, uVar54 != uVar35; uVar54 = uVar54 + 1) {
          lVar42 = (long)local_17c;
          opt_g_1._0_8_ = top_blob_g.cstep * uVar54 * top_blob_g.elemsize + (long)top_blob_g.data;
          opt_g_1.blob_allocator = (Allocator *)0x0;
          opt_g_1.workspace_allocator = (Allocator *)top_blob_g.elemsize;
          opt_g_1.use_winograd_convolution = (bool)(undefined1)top_blob_g.elempack;
          opt_g_1.use_sgemm_convolution = (bool)top_blob_g.elempack._1_1_;
          opt_g_1.use_int8_inference = (bool)top_blob_g.elempack._2_1_;
          opt_g_1.use_vulkan_compute = (bool)top_blob_g.elempack._3_1_;
          opt_g_1._32_8_ = top_blob_g.allocator;
          local_2b0 = (size_t)(top_blob_g.h * top_blob_g.w);
          top_blob_g._24_8_ = uVar23;
          Mat::~Mat((Mat *)&opt_g_1);
          lVar61 = (long)pAVar24 * local_250 * lVar42 + uVar22;
          lVar58 = (long)pAVar24 * local_240 * lVar42 + uVar22;
          lVar37 = sVar25 * sVar19 * uVar54;
          lVar36 = (long)pAVar24 * local_320 * lVar42 + uVar22;
          lVar47 = (long)pAVar24 * uVar55 * lVar42 + uVar22;
          for (lVar42 = 0; (int)lVar42 + 1 < iVar52; lVar42 = lVar42 + 2) {
            *(undefined1 *)((long)pvVar60 + lVar42 * 4 + lVar37) = *(undefined1 *)(lVar47 + lVar42);
            *(undefined1 *)((long)pvVar60 + lVar42 * 4 + lVar37 + 1) =
                 *(undefined1 *)(lVar47 + 1 + lVar42);
            *(undefined1 *)((long)pvVar60 + lVar42 * 4 + lVar37 + 2) =
                 *(undefined1 *)(lVar36 + lVar42);
            *(undefined1 *)((long)pvVar60 + lVar42 * 4 + lVar37 + 3) =
                 *(undefined1 *)(lVar36 + 1 + lVar42);
            *(undefined1 *)((long)pvVar60 + lVar42 * 4 + lVar37 + 4) =
                 *(undefined1 *)(lVar61 + lVar42);
            *(undefined1 *)((long)pvVar60 + lVar42 * 4 + lVar37 + 5) =
                 *(undefined1 *)(lVar61 + 1 + lVar42);
            *(undefined1 *)((long)pvVar60 + lVar42 * 4 + lVar37 + 6) =
                 *(undefined1 *)(lVar58 + lVar42);
            *(undefined1 *)((long)pvVar60 + lVar42 * 4 + lVar37 + 7) =
                 *(undefined1 *)(lVar58 + 1 + lVar42);
          }
          for (; (int)lVar42 < iVar52; lVar42 = lVar42 + 1) {
            *(undefined1 *)((long)pvVar60 + lVar42 * 4 + lVar37) = *(undefined1 *)(lVar47 + lVar42);
            *(undefined1 *)((long)pvVar60 + lVar42 * 4 + lVar37 + 1) =
                 *(undefined1 *)(lVar36 + lVar42);
            *(undefined1 *)((long)pvVar60 + lVar42 * 4 + lVar37 + 2) =
                 *(undefined1 *)(lVar61 + lVar42);
            *(undefined1 *)((long)pvVar60 + lVar42 * 4 + lVar37 + 3) =
                 *(undefined1 *)(lVar58 + lVar42);
          }
          local_250 = local_250 + 4;
          local_240 = local_240 + 4;
          local_320 = local_320 + 4;
          uVar55 = uVar55 + 4;
        }
        for (uVar64 = uVar43 & 0xfffffffc; pAVar24 = opt_g.workspace_allocator, uVar22 = opt_g._0_8_
            , uVar23 = top_blob_g._24_8_, (int)uVar64 < (int)uVar43; uVar64 = uVar64 + 1) {
          pvVar60 = (void *)((long)((int)uVar64 % 4 + (int)uVar64 / 4) * top_blob_g.cstep *
                             top_blob_g.elemsize + (long)top_blob_g.data);
          opt_g_1.blob_allocator = (Allocator *)0x0;
          opt_g_1.workspace_allocator = (Allocator *)top_blob_g.elemsize;
          opt_g_1.use_winograd_convolution = (bool)(undefined1)top_blob_g.elempack;
          opt_g_1.use_sgemm_convolution = (bool)top_blob_g.elempack._1_1_;
          opt_g_1.use_int8_inference = (bool)top_blob_g.elempack._2_1_;
          opt_g_1.use_vulkan_compute = (bool)top_blob_g.elempack._3_1_;
          opt_g_1._32_8_ = top_blob_g.allocator;
          local_2b0 = (size_t)(top_blob_g.h * top_blob_g.w);
          opt_g_1._0_8_ = pvVar60;
          top_blob_g._24_8_ = uVar23;
          Mat::~Mat((Mat *)&opt_g_1);
          lVar61 = (long)(int)(local_17c * uVar64) * (long)pAVar24 + uVar22;
          for (lVar58 = 0; (int)lVar58 + 1 < iVar52; lVar58 = lVar58 + 2) {
            *(undefined1 *)((long)pvVar60 + lVar58) = *(undefined1 *)(lVar61 + lVar58);
            *(undefined1 *)((long)pvVar60 + lVar58 + 1) = *(undefined1 *)(lVar61 + 1 + lVar58);
          }
          for (; (int)lVar58 < iVar52; lVar58 = lVar58 + 1) {
            *(undefined1 *)((long)pvVar60 + lVar58) = *(undefined1 *)(lVar61 + lVar58);
          }
        }
        Mat::Mat((Mat *)&opt_g_1,iVar40 * 4,iVar65,iVar53 / 4 + iVar53 % 4,1,
                 opt->workspace_allocator);
        uVar55 = 0;
        uVar35 = (ulong)(uint)(iVar53 >> 2);
        if (iVar53 >> 2 < 1) {
          uVar35 = uVar55;
        }
        iVar65 = iVar65 * iVar40;
        iVar32 = iVar65 * 4;
        iVar63 = iVar65 * 2;
        iVar28 = iVar65 * 3;
        iVar57 = iVar52;
        for (uVar54 = 0; pAVar24 = opt_g_1.workspace_allocator, uVar23 = opt_g_1._0_8_,
            uVar54 != uVar35; uVar54 = uVar54 + 1) {
          lVar58 = (int)uVar55 + lVar66;
          lVar36 = iVar57 + lVar66;
          sum0._0_8_ = local_2b0 * uVar54 * (long)opt_g_1.workspace_allocator + opt_g_1._0_8_;
          sum0[2] = 0;
          sum0[3] = 0;
          lVar42 = iVar63 + lVar66;
          lVar47 = iVar28 + lVar66;
          Mat::~Mat((Mat *)sum0);
          lVar37 = local_2b0 * (long)pAVar24 * uVar54 + uVar23;
          for (lVar61 = 0; (int)lVar61 + 1 < iVar52; lVar61 = lVar61 + 2) {
            *(undefined1 *)(lVar37 + lVar61 * 4) = *(undefined1 *)(lVar58 + lVar61);
            *(undefined1 *)(lVar37 + 1 + lVar61 * 4) = *(undefined1 *)(lVar58 + 1 + lVar61);
            *(undefined1 *)(lVar37 + 2 + lVar61 * 4) = *(undefined1 *)(lVar36 + lVar61);
            *(undefined1 *)(lVar37 + 3 + lVar61 * 4) = *(undefined1 *)(lVar36 + 1 + lVar61);
            *(undefined1 *)(lVar37 + 4 + lVar61 * 4) = *(undefined1 *)(lVar42 + lVar61);
            *(undefined1 *)(lVar37 + 5 + lVar61 * 4) = *(undefined1 *)(lVar42 + 1 + lVar61);
            *(undefined1 *)(lVar37 + 6 + lVar61 * 4) = *(undefined1 *)(lVar47 + lVar61);
            *(undefined1 *)(lVar37 + 7 + lVar61 * 4) = *(undefined1 *)(lVar47 + 1 + lVar61);
          }
          for (; (int)lVar61 < iVar52; lVar61 = lVar61 + 1) {
            *(undefined1 *)(lVar37 + lVar61 * 4) = *(undefined1 *)(lVar58 + lVar61);
            *(undefined1 *)(lVar37 + 1 + lVar61 * 4) = *(undefined1 *)(lVar36 + lVar61);
            *(undefined1 *)(lVar37 + 2 + lVar61 * 4) = *(undefined1 *)(lVar42 + lVar61);
            *(undefined1 *)(lVar37 + 3 + lVar61 * 4) = *(undefined1 *)(lVar47 + lVar61);
          }
          uVar55 = (ulong)(uint)((int)uVar55 + iVar32);
          iVar57 = iVar57 + iVar32;
          iVar63 = iVar63 + iVar32;
          iVar28 = iVar28 + iVar32;
        }
        iVar28 = iVar65 * ((uint)(uVar34 >> 2) & 0x3fffffff) * 4;
        uVar54 = uVar34 & 0xfffffffffffffffc;
        for (uVar55 = uVar54; (long)uVar55 < (long)uVar34; uVar55 = uVar55 + 1) {
          uVar38 = (ulong)(uint)((int)uVar55 >> 0x1f) << 0x20 | uVar55 & 0xffffffff;
          lVar58 = iVar28 + lVar66;
          lVar36 = (long)((int)((long)uVar38 % 4) + (int)((long)uVar38 / 4)) * local_2b0 *
                   (long)opt_g_1.workspace_allocator + opt_g_1._0_8_;
          sum0[2] = 0;
          sum0[3] = 0;
          sum0._0_8_ = lVar36;
          Mat::~Mat((Mat *)sum0);
          for (lVar61 = 0; (int)lVar61 + 1 < iVar52; lVar61 = lVar61 + 2) {
            *(undefined1 *)(lVar36 + lVar61) = *(undefined1 *)(lVar58 + lVar61);
            *(undefined1 *)(lVar36 + 1 + lVar61) = *(undefined1 *)(lVar58 + 1 + lVar61);
          }
          for (; (int)lVar61 < iVar52; lVar61 = lVar61 + 1) {
            *(undefined1 *)(lVar36 + lVar61) = *(undefined1 *)(lVar58 + lVar61);
          }
          iVar28 = iVar28 + iVar52;
        }
        for (uVar55 = 0; uVar55 != uVar35; uVar55 = uVar55 + 1) {
          uVar38 = uVar55 * 4;
          if (lVar68 == 0) {
            fVar73 = 0.0;
            fVar2 = 0.0;
            fVar72 = 0.0;
            fVar71 = 0.0;
          }
          else {
            fVar72 = *(float *)(lVar68 + uVar55 * 0x10);
            fVar71 = *(float *)(lVar68 + 4 + uVar55 * 0x10);
            fVar2 = *(float *)(lVar68 + 8 + uVar55 * 0x10);
            fVar73 = *(float *)(lVar68 + 0xc + uVar55 * 0x10);
          }
          fVar3 = local_e8._M_impl.super__Vector_impl_data._M_start[uVar55 * 4];
          fVar4 = local_e8._M_impl.super__Vector_impl_data._M_start[uVar38 | 1];
          fVar5 = local_e8._M_impl.super__Vector_impl_data._M_start[uVar38 | 2];
          fVar6 = local_e8._M_impl.super__Vector_impl_data._M_start[uVar38 | 3];
          uVar64 = (uint)uVar38;
          Mat::channel((Mat *)sum0,top_blob,uVar64);
          pfVar46 = (float *)sum0._0_8_;
          Mat::~Mat((Mat *)sum0);
          Mat::channel((Mat *)sum0,top_blob,uVar64 | 1);
          pfVar69 = (float *)sum0._0_8_;
          Mat::~Mat((Mat *)sum0);
          Mat::channel((Mat *)sum0,top_blob,uVar64 | 2);
          pfVar51 = (float *)sum0._0_8_;
          Mat::~Mat((Mat *)sum0);
          Mat::channel((Mat *)sum0,top_blob,uVar64 | 3);
          pfVar49 = (float *)sum0._0_8_;
          Mat::~Mat((Mat *)sum0);
          for (uVar38 = 0; (long)(uVar38 | 3) < (long)(int)uVar43; uVar38 = uVar38 + 4) {
            pvVar60 = (void *)((uVar38 >> 2) * top_blob_g.cstep * top_blob_g.elemsize +
                              (long)top_blob_g.data);
            sum0[2] = 0;
            sum0[3] = 0;
            sum0._0_8_ = pvVar60;
            Mat::~Mat((Mat *)sum0);
            pcVar70 = (char *)(local_2b0 * uVar55 * (long)opt_g_1.workspace_allocator +
                              opt_g_1._0_8_);
            sum0[2] = 0;
            sum0[3] = 0;
            sum0._0_8_ = pcVar70;
            Mat::~Mat((Mat *)sum0);
            sum0[0] = 0;
            sum0[1] = 0;
            sum0[2] = 0;
            sum0[3] = 0;
            requantize_scales.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            requantize_scales.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            sum1[0] = 0;
            sum1[1] = 0;
            sum1[2] = 0;
            sum1[3] = 0;
            sum2[0] = 0;
            sum2[1] = 0;
            sum2[2] = 0;
            sum2[3] = 0;
            for (uVar64 = 0; (int)(uVar64 | 1) < iVar52; uVar64 = uVar64 + 2) {
              cVar11 = *pcVar70;
              cVar12 = pcVar70[1];
              cVar13 = pcVar70[2];
              cVar14 = pcVar70[3];
              cVar15 = pcVar70[4];
              cVar16 = pcVar70[5];
              cVar17 = pcVar70[6];
              cVar18 = pcVar70[7];
              for (lVar66 = 0; lVar66 != 8; lVar66 = lVar66 + 2) {
                iVar63 = (int)*(char *)((long)pvVar60 + lVar66);
                iVar57 = (int)*(char *)((long)pvVar60 + lVar66 + 1);
                iVar28 = *(int *)((long)&requantize_scales.
                                         super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                         super__Vector_impl_data._M_start + lVar66 * 2);
                *(int *)((long)sum0 + lVar66 * 2) =
                     iVar57 * cVar12 + iVar63 * cVar11 + *(int *)((long)sum0 + lVar66 * 2);
                piVar1 = (int *)((long)sum1 + lVar66 * 2);
                *piVar1 = *piVar1 + iVar57 * cVar16 + iVar63 * cVar15;
                *(int *)((long)&requantize_scales.super__Vector_base<float,_std::allocator<float>_>.
                                _M_impl.super__Vector_impl_data._M_start + lVar66 * 2) =
                     iVar57 * cVar14 + iVar63 * cVar13 + iVar28;
                piVar1 = (int *)((long)sum2 + lVar66 * 2);
                *piVar1 = *piVar1 + iVar57 * cVar18 + iVar63 * cVar17;
              }
              pcVar70 = pcVar70 + 8;
              pvVar60 = (void *)((long)pvVar60 + 8);
            }
            for (; (int)uVar64 < iVar52; uVar64 = uVar64 + 1) {
              cVar11 = *pcVar70;
              cVar12 = pcVar70[1];
              cVar13 = pcVar70[2];
              cVar14 = pcVar70[3];
              for (lVar66 = 0; lVar66 != 4; lVar66 = lVar66 + 1) {
                iVar28 = (int)*(char *)((long)pvVar60 + lVar66);
                sum0[lVar66] = sum0[lVar66] + iVar28 * cVar11;
                piVar1 = (int *)((long)&requantize_scales.
                                        super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                        super__Vector_impl_data._M_start + lVar66 * 4);
                *piVar1 = *piVar1 + iVar28 * cVar12;
                sum1[lVar66] = sum1[lVar66] + iVar28 * cVar13;
                sum2[lVar66] = sum2[lVar66] + iVar28 * cVar14;
              }
              pcVar70 = pcVar70 + 4;
              pvVar60 = (void *)((long)pvVar60 + 4);
            }
            for (lVar66 = 0; lVar66 != 0x10; lVar66 = lVar66 + 4) {
              *(float *)((long)pfVar46 + lVar66) =
                   (float)*(int *)((long)sum0 + lVar66) * fVar3 + fVar72;
              *(float *)((long)pfVar69 + lVar66) =
                   (float)*(int *)((long)&requantize_scales.
                                          super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                          super__Vector_impl_data._M_start + lVar66) * fVar4 +
                   fVar71;
              *(float *)((long)pfVar51 + lVar66) =
                   (float)*(int *)((long)sum1 + lVar66) * fVar5 + fVar2;
              *(float *)((long)pfVar49 + lVar66) =
                   (float)*(int *)((long)sum2 + lVar66) * fVar6 + fVar73;
            }
            pfVar46 = pfVar46 + 4;
            pfVar69 = pfVar69 + 4;
            pfVar51 = pfVar51 + 4;
            pfVar49 = pfVar49 + 4;
          }
          while (pvVar60 = top_blob_g.data, uVar64 = (uint)uVar38, (int)uVar64 < (int)uVar43) {
            uVar38 = (ulong)((uVar64 & 3) + ((uint)(uVar38 >> 2) & 0x3fffffff));
            lVar66 = top_blob_g.cstep * top_blob_g.elemsize;
            sum0._0_8_ = uVar38 * lVar66 + (long)top_blob_g.data;
            sum0[2] = 0;
            sum0[3] = 0;
            Mat::~Mat((Mat *)sum0);
            uVar23 = opt_g_1._0_8_;
            lVar61 = local_2b0 * uVar55 * (long)opt_g_1.workspace_allocator;
            pcVar70 = (char *)(opt_g_1._0_8_ + lVar61);
            sum0[2] = 0;
            sum0[3] = 0;
            sum0._0_8_ = pcVar70;
            Mat::~Mat((Mat *)sum0);
            lVar66 = lVar66 * uVar38;
            iVar32 = 0;
            iVar63 = 0;
            iVar57 = 0;
            iVar28 = 0;
            for (lVar58 = 0; (int)lVar58 + 1 < iVar52; lVar58 = lVar58 + 2) {
              iVar45 = (int)*(char *)((long)pvVar60 + lVar58 + lVar66);
              iVar53 = (int)*(char *)((long)pvVar60 + lVar58 + lVar66 + 1);
              iVar32 = pcVar70[1] * iVar53 + *pcVar70 * iVar45 + iVar32;
              iVar63 = pcVar70[3] * iVar53 + pcVar70[2] * iVar45 + iVar63;
              iVar57 = pcVar70[5] * iVar53 + pcVar70[4] * iVar45 + iVar57;
              iVar28 = pcVar70[7] * iVar53 + pcVar70[6] * iVar45 + iVar28;
              pcVar70 = pcVar70 + 8;
            }
            lVar61 = uVar23 + lVar61;
            for (; (int)lVar58 < iVar52; lVar58 = lVar58 + 1) {
              iVar45 = (int)*(char *)((long)pvVar60 + lVar58 + lVar66);
              iVar32 = iVar32 + *(char *)(lVar61 + lVar58 * 4) * iVar45;
              iVar63 = iVar63 + *(char *)(lVar61 + 1 + lVar58 * 4) * iVar45;
              iVar57 = iVar57 + *(char *)(lVar61 + 2 + lVar58 * 4) * iVar45;
              iVar28 = iVar28 + *(char *)(lVar61 + 3 + lVar58 * 4) * iVar45;
            }
            *pfVar46 = (float)iVar32 * fVar3 + fVar72;
            *pfVar69 = (float)iVar63 * fVar4 + fVar71;
            *pfVar51 = (float)iVar57 * fVar5 + fVar2;
            *pfVar49 = (float)iVar28 * fVar6 + fVar73;
            pfVar46 = pfVar46 + 1;
            pfVar69 = pfVar69 + 1;
            pfVar51 = pfVar51 + 1;
            pfVar49 = pfVar49 + 1;
            uVar38 = (ulong)(uVar64 + 1);
          }
        }
        iVar28 = 0;
        if (0 < iVar52) {
          iVar28 = iVar52;
        }
        for (; (long)uVar54 < (long)uVar34; uVar54 = uVar54 + 1) {
          iVar57 = (int)uVar54;
          Mat::channel((Mat *)sum0,top_blob,iVar57);
          pfVar46 = (float *)sum0._0_8_;
          Mat::~Mat((Mat *)sum0);
          if (lVar68 == 0) {
            fVar72 = 0.0;
          }
          else {
            fVar72 = *(float *)(lVar68 + uVar54 * 4);
          }
          fVar71 = local_e8._M_impl.super__Vector_impl_data._M_start[uVar54];
          iVar63 = (int)((long)((ulong)(uint)(iVar57 >> 0x1f) << 0x20 | uVar54 & 0xffffffff) / 4);
          lVar66 = (long)(iVar63 * -3 + iVar57);
          for (uVar35 = 0; (long)(uVar35 | 3) < (long)(int)uVar43; uVar35 = uVar35 + 4) {
            pvVar60 = (void *)((uVar35 >> 2) * top_blob_g.cstep * top_blob_g.elemsize +
                              (long)top_blob_g.data);
            sum0[2] = 0;
            sum0[3] = 0;
            sum0._0_8_ = pvVar60;
            Mat::~Mat((Mat *)sum0);
            pcVar70 = (char *)(local_2b0 * lVar66 * (long)opt_g_1.workspace_allocator +
                              opt_g_1._0_8_);
            sum0[2] = 0;
            sum0[3] = 0;
            sum0._0_8_ = pcVar70;
            Mat::~Mat((Mat *)sum0);
            sum0[0] = 0;
            sum0[1] = 0;
            sum0[2] = 0;
            sum0[3] = 0;
            for (uVar64 = 0; (int)(uVar64 | 1) < iVar52; uVar64 = uVar64 + 2) {
              cVar11 = *pcVar70;
              cVar12 = pcVar70[1];
              for (lVar61 = 0; lVar61 != 4; lVar61 = lVar61 + 1) {
                sum0[lVar61] = (int)*(char *)((long)pvVar60 + lVar61 * 2 + 1) * (int)cVar12 +
                               (int)*(char *)((long)pvVar60 + lVar61 * 2) * (int)cVar11 +
                               sum0[lVar61];
              }
              pcVar70 = pcVar70 + 2;
              pvVar60 = (void *)((long)pvVar60 + 8);
            }
            for (; (int)uVar64 < iVar52; uVar64 = uVar64 + 1) {
              cVar11 = *pcVar70;
              for (lVar61 = 0; lVar61 != 4; lVar61 = lVar61 + 1) {
                sum0[lVar61] = sum0[lVar61] + (int)*(char *)((long)pvVar60 + lVar61) * (int)cVar11;
              }
              pcVar70 = pcVar70 + 1;
              pvVar60 = (void *)((long)pvVar60 + 4);
            }
            for (lVar61 = 0; lVar61 != 4; lVar61 = lVar61 + 1) {
              pfVar46[lVar61] = (float)sum0[lVar61] * fVar71 + fVar72;
            }
            pfVar46 = pfVar46 + 4;
          }
          while (pvVar60 = top_blob_g.data, uVar64 = (uint)uVar35, (int)uVar64 < (int)uVar43) {
            uVar35 = (ulong)((uVar64 & 3) + ((uint)(uVar35 >> 2) & 0x3fffffff));
            lVar58 = top_blob_g.cstep * top_blob_g.elemsize;
            sum0._0_8_ = uVar35 * lVar58 + (long)top_blob_g.data;
            sum0[2] = 0;
            sum0[3] = 0;
            Mat::~Mat((Mat *)sum0);
            pAVar24 = opt_g_1.workspace_allocator;
            uVar23 = opt_g_1._0_8_;
            sum0._0_8_ = local_2b0 * lVar66 * (long)opt_g_1.workspace_allocator + opt_g_1._0_8_;
            sum0[2] = 0;
            sum0[3] = 0;
            Mat::~Mat((Mat *)sum0);
            iVar32 = 0;
            for (lVar61 = 0; iVar28 != (int)lVar61; lVar61 = lVar61 + 1) {
              iVar32 = iVar32 + (int)*(char *)((long)pvVar60 + lVar61 + lVar58 * uVar35) *
                                (int)*(char *)(local_2b0 * (long)(iVar57 + iVar63 * -3) *
                                               (long)pAVar24 + uVar23 + lVar61);
            }
            *pfVar46 = (float)iVar32 * fVar71 + fVar72;
            pfVar46 = pfVar46 + 1;
            uVar35 = (ulong)(uVar64 + 1);
          }
        }
        Mat::~Mat((Mat *)&opt_g_1);
        Mat::~Mat(&top_blob_g);
        Mat::~Mat((Mat *)&opt_g);
        std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base(&local_e8);
        std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                  ((_Vector_base<float,_std::allocator<float>_> *)&top_blob_tm);
      }
      pLVar21 = this->activation;
      iVar45 = 0;
      if (pLVar21 != (Layer *)0x0) {
        (*pLVar21->_vptr_Layer[9])(pLVar21,top_blob,opt);
      }
    }
  }
LAB_0013e021:
  Mat::~Mat(&bottom_blob_bordered);
  Mat::~Mat(&bottom_blob_unbordered);
  return iVar45;
}

Assistant:

int Convolution_x86::forward_int8_x86(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    if (dilation_w > 1 || dilation_h > 1)
    {
        return Convolution::forward(bottom_blob, top_blob, opt);
    }

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    size_t elemsize = bottom_blob.elemsize;

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    Mat bottom_blob_unbordered = bottom_blob;
    if (elemsize != 1)
    {
        Option opt_g = opt;
        opt_g.blob_allocator = opt.workspace_allocator;

        quantize_float32_to_int8(bottom_blob, bottom_blob_unbordered, bottom_blob_int8_scale, opt_g);
    }

    Mat bottom_blob_bordered;
    make_padding(bottom_blob_unbordered, bottom_blob_bordered, opt);
    if (bottom_blob_bordered.empty())
        return -100;

    w = bottom_blob_bordered.w;
    h = bottom_blob_bordered.h;

    int outw = (w - kernel_extent_w) / stride_w + 1;
    int outh = (h - kernel_extent_h) / stride_h + 1;

    // int8
    size_t out_elemsize = use_int8_requantize ? 1u : 4u;

    top_blob.create(outw, outh, num_output, out_elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    // int8
    if (use_int8_requantize)
    {
        Mat top_blob_tm;
        top_blob_tm.create(outw, outh, num_output, (size_t)4u, opt.workspace_allocator);
        if (top_blob_tm.empty())
            return -100;

        if (use_winograd3x3_int8)
        {
            conv3x3s1_winograd23_int8_sse(bottom_blob_bordered, top_blob_tm, weight_3x3_winograd23_data_int8, opt);
//             conv3x3s1_winograd43_int8_sse(bottom_blob_bordered, top_blob_tm, weight_3x3_winograd23_data_int8, opt);

            // requantize, reverse scale inplace
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p=0; p<num_output; p++)
            {
                Option opt_g = opt;
                opt_g.num_threads = 1;
                opt_g.blob_allocator = top_blob.allocator;

                Mat top_blob_tm_g = top_blob_tm.channel_range(p, 1);
                Mat top_blob_g = top_blob.channel_range(p, 1);

                // requantize and relu
                float scale_in;
                if (weight_data_int8_scales[p] == 0)
                    scale_in = 0;
                else
                    scale_in = 1.f / (bottom_blob_int8_scale * weight_data_int8_scales[p]);

                float scale_out = top_blob_int8_scale;//FIXME load param

                requantize_int8_to_int8(top_blob_tm_g, top_blob_g, scale_in, scale_out, bias_term ? (const float*)bias_data + p : 0, bias_term ? 1 : 0, 0, opt_g);
            }
        }
        else
        {
            std::vector<float> requantize_scales;
            for (int p=0; p<num_output; p++)
            {
                float scale_in;
                if (weight_data_int8_scales[p] == 0)
                    scale_in = 0;
                else
                    scale_in = 1.f / (bottom_blob_int8_scale * weight_data_int8_scales[p]);

                float scale_out = top_blob_int8_scale;

                requantize_scales.push_back(scale_in);
                requantize_scales.push_back(scale_out);
            }

            conv_im2col_sgemm_int8_requant_sse(bottom_blob_bordered, top_blob, weight_data, kernel_w, kernel_h, stride_w, stride_h, bias_data, requantize_scales, opt);
        }
    }
    else
    {
        if (use_winograd3x3_int8)
        {
            conv3x3s1_winograd23_int8_sse(bottom_blob_bordered, top_blob, weight_3x3_winograd23_data_int8, opt);
//             conv3x3s1_winograd43_int8_sse(bottom_blob_bordered, top_blob, weight_3x3_winograd23_data_int8, opt);

            // dequantize, reverse scale inplace
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p=0; p<num_output; p++)
            {
                Option opt_g = opt;
                opt_g.num_threads = 1;
                opt_g.blob_allocator = top_blob.allocator;

                Mat top_blob_g = top_blob.channel_range(p, 1);

                // dequantize
                float scale_in;
                if (weight_data_int8_scales[p] == 0)
                    scale_in = 0;
                else
                    scale_in = 1.f / (bottom_blob_int8_scale * weight_data_int8_scales[p]);

                dequantize_int32_to_float32(top_blob_g, scale_in, bias_term ? (const float*)bias_data + p : 0, bias_term ? 1 : 0, opt_g);
            }
        }
        else
        {
            std::vector<float> dequantize_scales;
            for (int p=0; p<num_output; p++)
            {
                float scale_in;
                if (weight_data_int8_scales[p] == 0)
                    scale_in = 0;
                else
                    scale_in = 1.f / (bottom_blob_int8_scale * weight_data_int8_scales[p]);

                dequantize_scales.push_back(scale_in);
            }

            conv_im2col_sgemm_int8_dequant_sse(bottom_blob_bordered, top_blob, weight_data, kernel_w, kernel_h, stride_w, stride_h, bias_data, dequantize_scales, opt);
        }
    }

    if (activation)
    {
        activation->forward_inplace(top_blob, opt);
    }

    return 0;
}